

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_reserve_success_enoughCapacityBufferNotNull_fn(int _i)

{
  bool bVar1;
  char *pcVar2;
  char *expr;
  ulong uVar3;
  int line;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  code *local_48;
  code *pcStack_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  void *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 8;
  local_38 = 0;
  local_28 = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_20 = private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  for (uVar3 = 0; uVar3 < 7; uVar3 = uVar3 + 1) {
    *(undefined1 *)((long)local_20 + uVar3) = 0x35;
  }
  *(undefined1 *)((long)local_20 + 7) = 0x30;
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  bVar1 = private_ACUtils_ADynArray_reserve(&local_48,8,false,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xca);
    if (local_30 == 8) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xcb);
      if (local_28 == 8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0xcc);
        if (local_20 == (void *)0x0) {
          uVar3 = 0;
          pcVar7 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %#x";
          pcVar4 = "(void*) array.buffer != NULL";
          pcVar5 = "(void*) array.buffer";
          line = 0xcd;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xcd);
          for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
            if ((long)*(char *)((long)local_20 + lVar6) != 0x35) {
              pcVar7 = "\'5\'";
              expr = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
              pcVar4 = "array.buffer[i] == \'5\'";
              pcVar5 = "array.buffer[i]";
              line = 0xcf;
              uVar3 = (long)*(char *)((long)local_20 + lVar6);
              goto LAB_0010ae36;
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0xcf);
          }
          uVar3 = (ulong)*(char *)((long)local_20 + 7);
          if (uVar3 == 0x30) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0xd0);
            if (local_38 == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0xd1);
              (*pcStack_40)(local_20);
              return;
            }
            pcVar7 = (char *)0x0;
            expr = "Assertion \'_ck_x == NULL\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %#x";
            pcVar4 = "(void*) array.growStrategy == NULL";
            pcVar5 = "(void*) array.growStrategy";
            line = 0xd1;
            uVar3 = local_38;
          }
          else {
            pcVar7 = "\'0\'";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar4 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
            pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
            line = 0xd0;
          }
        }
      }
      else {
        pcVar7 = "private_ACUtilsTest_ADynArray_capacityMin";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar4 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
        pcVar5 = "array.capacity";
        line = 0xcc;
        uVar3 = local_28;
      }
    }
    else {
      pcVar7 = "private_ACUtilsTest_ADynArray_capacityMin";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar5 = "array.size";
      line = 0xcb;
      uVar3 = local_30;
    }
  }
  else {
    uVar3 = (ulong)bVar1;
    pcVar7 = "true";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = 
    "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer))";
    line = 0xca;
  }
LAB_0010ae36:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar2,pcVar4,pcVar5,uVar3,pcVar7);
}

Assistant:

START_TEST(test_ADynArray_reserve_success_enoughCapacityBufferNotNull)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = nullptr;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, array.capacity), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NULL(array.growStrategy);
    array.deallocator(array.buffer);
}